

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O2

char * fs_getcwd(char *buffer,int buffer_size)

{
  char *pcVar1;
  
  dbg_assert_imp("/workspace/llm4binary/github/license_all_cmakelists_1510/TsFreddie[P]teeworlds/src/base/system.c"
                 ,0x706,(uint)(buffer != (char *)0x0),"buffer invalid");
  dbg_assert_imp("/workspace/llm4binary/github/license_all_cmakelists_1510/TsFreddie[P]teeworlds/src/base/system.c"
                 ,0x707,(uint)(0 < buffer_size),"buffer_size invalid");
  pcVar1 = getcwd(buffer,(long)buffer_size);
  if (pcVar1 == (char *)0x0) {
    *buffer = '\0';
    buffer = (char *)0x0;
  }
  return buffer;
}

Assistant:

char *fs_getcwd(char *buffer, int buffer_size)
{
#if defined(CONF_FAMILY_WINDOWS)
	WCHAR wBuffer[IO_MAX_PATH_LENGTH];
#endif
	dbg_assert(buffer != 0, "buffer invalid");
	dbg_assert(buffer_size > 0, "buffer_size invalid");
#if defined(CONF_FAMILY_WINDOWS)
	if(_wgetcwd(wBuffer, buffer_size) == 0)
	{
		buffer[0] = '\0';
		return 0;
	}
	WideCharToMultiByte(CP_UTF8, 0, wBuffer, -1, buffer, buffer_size, NULL, NULL);
	return buffer;
#else
	if(getcwd(buffer, buffer_size) == 0)
	{
		buffer[0] = '\0';
		return 0;
	}
	return buffer;
#endif
}